

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

void __thiscall
Fixpp::impl::
MessageVisitor<should_visit_incremental_refresh_frame::Visitor,DefaultTestRules<Fixpp::v42::Spec::Dictionary>>
::operator()(MessageVisitor<should_visit_incremental_refresh_frame::Visitor,DefaultTestRules<Fixpp::v42::Spec::Dictionary>>
             *this)

{
  StreamCursor *this_00;
  ParsingContext *pPVar1;
  bool bVar2;
  char local_4e9;
  char local_4d9;
  byte local_4ca;
  undefined1 local_4b8 [8];
  Token valueToken;
  FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_j_>,_Fixpp::TagT<45U,_Fixpp::Type::Int>,_Fixpp::Required<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::TagT<379U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<380U,_Fixpp::Type::Int>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  messageVisitor_1;
  FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_j_>,_Fixpp::TagT<45U,_Fixpp::Type::Int>,_Fixpp::Required<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::TagT<379U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<380U,_Fixpp::Type::Int>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  messageVisitor;
  FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>_>
  headerVisitor;
  int tag;
  StreamCursor *cursor;
  int local_448;
  int checksum;
  State state;
  undefined1 local_438 [8];
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_j_>,_Fixpp::TagT<45U,_Fixpp::Type::Int>,_Fixpp::Required<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::TagT<379U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<380U,_Fixpp::Type::Int>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  message;
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  header;
  MessageVisitor<should_visit_incremental_refresh_frame::Visitor,_DefaultTestRules<Fixpp::v42::Spec::Dictionary>_>
  *this_local;
  
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  ::VersionnedMessageRef
            ((VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
              *)((long)(message.
                        super_MessageRef<Fixpp::Chars<_j_>,_Fixpp::TagT<45U,_Fixpp::Type::Int>,_Fixpp::Required<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::TagT<379U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<380U,_Fixpp::Type::Int>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                        .
                        super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<45U,_Fixpp::Type::Int>,_Fixpp::Required<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::TagT<379U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<380U,_Fixpp::Type::Int>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                        .unparsed.Storage.InlineElts + 8) + 0x10));
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<'j'>,_Fixpp::TagT<45U,_Fixpp::Type::Int>,_Fixpp::Required<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::TagT<379U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<380U,_Fixpp::Type::Int>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  ::VersionnedMessageRef
            ((VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_j_>,_Fixpp::TagT<45U,_Fixpp::Type::Int>,_Fixpp::Required<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::TagT<379U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<380U,_Fixpp::Type::Int>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
              *)local_438);
  local_448 = 0;
  cursor._4_4_ = 0;
  this_00 = (StreamCursor *)**(undefined8 **)this;
LAB_01553f6c:
  do {
    bVar2 = StreamCursor::eof(this_00);
    local_4ca = 0;
    if (!bVar2) {
      bVar2 = MessageVisitor<should_visit_incremental_refresh_frame::Visitor,_DefaultTestRules<Fixpp::v42::Spec::Dictionary>_>
              ::hasError((MessageVisitor<should_visit_incremental_refresh_frame::Visitor,_DefaultTestRules<Fixpp::v42::Spec::Dictionary>_>
                          *)this);
      local_4ca = bVar2 ^ 0xff;
    }
    if ((local_4ca & 1) == 0) {
LAB_0155442b:
      bVar2 = MessageVisitor<should_visit_incremental_refresh_frame::Visitor,_DefaultTestRules<Fixpp::v42::Spec::Dictionary>_>
              ::hasError((MessageVisitor<should_visit_incremental_refresh_frame::Visitor,_DefaultTestRules<Fixpp::v42::Spec::Dictionary>_>
                          *)this);
      if (!bVar2) {
        callVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<>,Fixpp::Required<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::TagT<115u,Fixpp::Type::String>,Fixpp::TagT<128u,Fixpp::Type::String>,Fixpp::TagT<90u,Fixpp::Type::Int>,Fixpp::TagT<91u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::TagT<50u,Fixpp::Type::String>,Fixpp::TagT<142u,Fixpp::Type::String>,Fixpp::TagT<57u,Fixpp::Type::String>,Fixpp::TagT<143u,Fixpp::Type::String>,Fixpp::TagT<116u,Fixpp::Type::String>,Fixpp::TagT<144u,Fixpp::Type::String>,Fixpp::TagT<129u,Fixpp::Type::String>,Fixpp::TagT<145u,Fixpp::Type::String>,Fixpp::TagT<43u,Fixpp::Type::Boolean>,Fixpp::TagT<97u,Fixpp::Type::Boolean>,Fixpp::Required<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<212u,Fixpp::Type::Int>,Fixpp::TagT<213u,Fixpp::Type::Data>,Fixpp::TagT<347u,Fixpp::Type::String>,Fixpp::TagT<369u,Fixpp::Type::Int>,Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>,Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)106>,Fixpp::TagT<45u,Fixpp::Type::Int>,Fixpp::Required<Fixpp::TagT<372u,Fixpp::Type::String>>,Fixpp::TagT<379u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<380u,Fixpp::Type::Int>>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>
                  (this,(long)(message.
                               super_MessageRef<Fixpp::Chars<_j_>,_Fixpp::TagT<45U,_Fixpp::Type::Int>,_Fixpp::Required<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::TagT<379U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<380U,_Fixpp::Type::Int>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                               .
                               super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<45U,_Fixpp::Type::Int>,_Fixpp::Required<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::TagT<379U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<380U,_Fixpp::Type::Int>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                               .unparsed.Storage.InlineElts + 8) + 0x10,local_438);
      }
      headerVisitor.strict = false;
      headerVisitor.skipUnknown = false;
      headerVisitor._10_2_ = 0;
      goto LAB_01554473;
    }
    bVar2 = match_int_fast((int *)&headerVisitor.field_0xc,this_00);
    if (!bVar2) {
      pPVar1 = *(ParsingContext **)this;
      bVar2 = StreamCursor::eof(this_00);
      if (bVar2) {
        local_4d9 = '?';
      }
      else {
        local_4d9 = StreamCursor::current(this_00);
      }
      ParsingContext::setError
                (pPVar1,ParsingError,"Encountered invalid tag, expected int, got \'%c\'",
                 (ulong)(uint)(int)local_4d9);
      headerVisitor.strict = true;
      headerVisitor.skipUnknown = false;
      headerVisitor._10_2_ = 0;
      goto LAB_01554473;
    }
    bVar2 = StreamCursor::advance(this_00,1);
    if (!bVar2) {
      ParsingContext::setError
                (*(ParsingContext **)this,Incomplete,"Expected value after Tag %d, got EOF",
                 (ulong)(uint)headerVisitor._12_4_);
      headerVisitor.strict = true;
      headerVisitor.skipUnknown = false;
      headerVisitor._10_2_ = 0;
      goto LAB_01554473;
    }
    if (local_448 == 0) {
      FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>_>
      ::FieldVisitor((FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>_>
                      *)&messageVisitor.strict,*(ParsingContext **)this,false,false);
      bVar2 = visitField<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<>,Fixpp::Required<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::TagT<115u,Fixpp::Type::String>,Fixpp::TagT<128u,Fixpp::Type::String>,Fixpp::TagT<90u,Fixpp::Type::Int>,Fixpp::TagT<91u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::TagT<50u,Fixpp::Type::String>,Fixpp::TagT<142u,Fixpp::Type::String>,Fixpp::TagT<57u,Fixpp::Type::String>,Fixpp::TagT<143u,Fixpp::Type::String>,Fixpp::TagT<116u,Fixpp::Type::String>,Fixpp::TagT<144u,Fixpp::Type::String>,Fixpp::TagT<129u,Fixpp::Type::String>,Fixpp::TagT<145u,Fixpp::Type::String>,Fixpp::TagT<43u,Fixpp::Type::Boolean>,Fixpp::TagT<97u,Fixpp::Type::Boolean>,Fixpp::Required<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<212u,Fixpp::Type::Int>,Fixpp::TagT<213u,Fixpp::Type::Data>,Fixpp::TagT<347u,Fixpp::Type::String>,Fixpp::TagT<369u,Fixpp::Type::I___xpp::Type::String>,Fixpp::TagT<369u,Fixpp::Type::Int>,Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>>>
                        ((VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                          *)((long)(message.
                                    super_MessageRef<Fixpp::Chars<_j_>,_Fixpp::TagT<45U,_Fixpp::Type::Int>,_Fixpp::Required<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::TagT<379U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<380U,_Fixpp::Type::Int>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                                    .
                                    super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<45U,_Fixpp::Type::Int>,_Fixpp::Required<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::TagT<379U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<380U,_Fixpp::Type::Int>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                                    .unparsed.Storage.InlineElts + 8) + 0x10),headerVisitor._12_4_,
                         (FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>_>
                          *)&messageVisitor.strict);
      if (bVar2) goto LAB_01553f6c;
      FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<'j'>,_Fixpp::TagT<45U,_Fixpp::Type::Int>,_Fixpp::Required<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::TagT<379U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<380U,_Fixpp::Type::Int>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
      ::FieldVisitor((FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_j_>,_Fixpp::TagT<45U,_Fixpp::Type::Int>,_Fixpp::Required<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::TagT<379U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<380U,_Fixpp::Type::Int>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
                      *)&messageVisitor_1.strict,*(ParsingContext **)this,false,false);
      bVar2 = visitField<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)106>,Fixpp::TagT<45u,Fixpp::Type::Int>,Fixpp::Required<Fixpp::TagT<372u,Fixpp::Type::String>>,Fixpp::TagT<379u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<380u,Fixpp::Type::Int>>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)106>,Fixpp::TagT<45u,Fixpp::Type::Int>,Fixpp::Required<Fixpp::TagT<372u,Fixpp::Type::String>>,Fixpp::TagT<379u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<380u,Fixpp::Type::Int>>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>
                        ((VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_j_>,_Fixpp::TagT<45U,_Fixpp::Type::Int>,_Fixpp::Required<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::TagT<379U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<380U,_Fixpp::Type::Int>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                          *)local_438,headerVisitor._12_4_,
                         (FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_j_>,_Fixpp::TagT<45U,_Fixpp::Type::Int>,_Fixpp::Required<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::TagT<379U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<380U,_Fixpp::Type::Int>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
                          *)&messageVisitor_1.strict);
      if (bVar2) {
        local_448 = 1;
        goto LAB_01553f6c;
      }
    }
    else if (local_448 == 1) {
      FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<'j'>,_Fixpp::TagT<45U,_Fixpp::Type::Int>,_Fixpp::Required<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::TagT<379U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<380U,_Fixpp::Type::Int>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
      ::FieldVisitor((FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_j_>,_Fixpp::TagT<45U,_Fixpp::Type::Int>,_Fixpp::Required<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::TagT<379U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<380U,_Fixpp::Type::Int>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
                      *)&valueToken.egptr,*(ParsingContext **)this,false,false);
      bVar2 = visitField<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)106>,Fixpp::TagT<45u,Fixpp::Type::Int>,Fixpp::Required<Fixpp::TagT<372u,Fixpp::Type::String>>,Fixpp::TagT<379u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<380u,Fixpp::Type::Int>>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)106>,Fixpp::TagT<45u,Fixpp::Type::Int>,Fixpp::Required<Fixpp::TagT<372u,Fixpp::Type::String>>,Fixpp::TagT<379u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<380u,Fixpp::Type::Int>>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>
                        ((VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_j_>,_Fixpp::TagT<45U,_Fixpp::Type::Int>,_Fixpp::Required<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::TagT<379U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<380U,_Fixpp::Type::Int>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                          *)local_438,headerVisitor._12_4_,
                         (FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_j_>,_Fixpp::TagT<45U,_Fixpp::Type::Int>,_Fixpp::Required<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::TagT<379U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<380U,_Fixpp::Type::Int>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
                          *)&valueToken.egptr);
      if (bVar2) goto LAB_01553f6c;
    }
    if (headerVisitor._12_4_ == 10) {
      bVar2 = match_int_fast((int *)((long)&cursor + 4),this_00);
      if (bVar2) goto LAB_0155442b;
      pPVar1 = *(ParsingContext **)this;
      bVar2 = StreamCursor::eof(this_00);
      if (bVar2) {
        local_4e9 = '?';
      }
      else {
        local_4e9 = StreamCursor::current(this_00);
      }
      ParsingContext::setError
                (pPVar1,ParsingError,"Invalid checksum, expected int, got \'%c\'",
                 (ulong)(uint)(int)local_4e9);
      headerVisitor.strict = true;
      headerVisitor.skipUnknown = false;
      headerVisitor._10_2_ = 0;
      goto LAB_01554473;
    }
    StreamCursor::Token::Token((Token *)local_4b8,this_00);
    bVar2 = match_until_fast('|',this_00);
    if (!bVar2) {
      ParsingContext::setError
                (*(ParsingContext **)this,ParsingError,"Expected value after tag %d, got EOF",
                 (ulong)(uint)headerVisitor._12_4_);
      headerVisitor.strict = true;
      headerVisitor.skipUnknown = false;
      headerVisitor._10_2_ = 0;
      goto LAB_01554473;
    }
    if (local_448 == 0) {
      handleUnknownTag<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<>,Fixpp::Required<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::TagT<115u,Fixpp::Type::String>,Fixpp::TagT<128u,Fixpp::Type::String>,Fixpp::TagT<90u,Fixpp::Type::Int>,Fixpp::TagT<91u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::TagT<50u,Fixpp::Type::String>,Fixpp::TagT<142u,Fixpp::Type::String>,Fixpp::TagT<57u,Fixpp::Type::String>,Fixpp::TagT<143u,Fixpp::Type::String>,Fixpp::TagT<116u,Fixpp::Type::String>,Fixpp::TagT<144u,Fixpp::Type::String>,Fixpp::TagT<129u,Fixpp::Type::String>,Fixpp::TagT<145u,Fixpp::Type::String>,Fixpp::TagT<43u,Fixpp::Type::Boolean>,Fixpp::TagT<97u,Fixpp::Type::Boolean>,Fixpp::Required<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<212u,Fixpp::Type::Int>,Fixpp::TagT<213u,Fixpp::Type::Data>,Fixpp::TagT<347u,Fixpp::Type::String>,Fixpp::TagT<369u,Fixpp::Type::Int>,Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>,Fixpp::TypedParsingContext<void>>
                (this,local_4b8,
                 (long)(message.
                        super_MessageRef<Fixpp::Chars<_j_>,_Fixpp::TagT<45U,_Fixpp::Type::Int>,_Fixpp::Required<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::TagT<379U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<380U,_Fixpp::Type::Int>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                        .
                        super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<45U,_Fixpp::Type::Int>,_Fixpp::Required<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::TagT<379U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<380U,_Fixpp::Type::Int>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                        .unparsed.Storage.InlineElts + 8) + 0x10,*(undefined8 *)this,
                 headerVisitor._12_4_);
    }
    else {
      handleUnknownTag<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)106>,Fixpp::TagT<45u,Fixpp::Type::Int>,Fixpp::Required<Fixpp::TagT<372u,Fixpp::Type::String>>,Fixpp::TagT<379u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<380u,Fixpp::Type::Int>>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::TypedParsingContext<void>>
                (this,local_4b8,local_438,*(undefined8 *)this,headerVisitor._12_4_);
    }
    bVar2 = StreamCursor::advance(this_00,1);
    if (!bVar2) {
      ParsingContext::setError(*(ParsingContext **)this,Incomplete,"Got early EOF");
      headerVisitor.strict = true;
      headerVisitor.skipUnknown = false;
      headerVisitor._10_2_ = 0;
LAB_01554473:
      VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<'j'>,_Fixpp::TagT<45U,_Fixpp::Type::Int>,_Fixpp::Required<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::TagT<379U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<380U,_Fixpp::Type::Int>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
      ::~VersionnedMessageRef
                ((VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_j_>,_Fixpp::TagT<45U,_Fixpp::Type::Int>,_Fixpp::Required<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::TagT<379U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<380U,_Fixpp::Type::Int>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                  *)local_438);
      VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
      ::~VersionnedMessageRef
                ((VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                  *)((long)(message.
                            super_MessageRef<Fixpp::Chars<_j_>,_Fixpp::TagT<45U,_Fixpp::Type::Int>,_Fixpp::Required<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::TagT<379U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<380U,_Fixpp::Type::Int>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                            .
                            super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<45U,_Fixpp::Type::Int>,_Fixpp::Required<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::TagT<379U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<380U,_Fixpp::Type::Int>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                            .unparsed.Storage.InlineElts + 8) + 0x10));
      return;
    }
  } while( true );
}

Assistant:

void operator()(id<Header>, id<Message>)
            {
                Header header;
                Message message;

                enum class State {
                    InHeader,
                    InMessage
                };

                State state = State::InHeader;

                int checksum = 0;

                auto& cursor = context.cursor;

                while (!cursor.eof() && !hasError())
                {
                    int tag;

                    TRY_MATCH_INT(
                        tag,
                        "Encountered invalid tag, expected int, got '%c'",
                        CURSOR_CURRENT(cursor)
                    );
                    TRY_ADVANCE("Expected value after Tag %d, got EOF", tag);

                    if (state == State::InHeader)
                    {
                        FieldVisitor<Header> headerVisitor(context, Rules::StrictMode, Rules::SkipUnknownTags);
                        if (visitField(header, tag, headerVisitor))
                            continue;

                        FieldVisitor<Message> messageVisitor(context, Rules::StrictMode, Rules::SkipUnknownTags);
                        if (visitField(message, tag, messageVisitor))
                        {
                            state = State::InMessage;
                            continue;
                        }
                    }
                    else if (state == State::InMessage)
                    {
                        FieldVisitor<Message> messageVisitor(context, Rules::StrictMode, Rules::SkipUnknownTags);
                        if (visitField(message, tag, messageVisitor))
                            continue;
                    }

                    if (tag == 10)
                    {
                        TRY_MATCH_INT(
                            checksum,
                            "Invalid checksum, expected int, got '%c'",
                             CURSOR_CURRENT(cursor)
                        );
                        break;
                    }
                    else
                    {
                        StreamCursor::Token valueToken(cursor);
                        TRY_MATCH_UNTIL(SOH, "Expected value after tag %d, got EOF", tag);

                        if (state == State::InHeader)
                            handleUnknownTag(valueToken, header, context, tag,
                                    BoolPack<Rules::SkipUnknownTags, Rules::StrictMode>{});
                        else
                            handleUnknownTag(valueToken, message, context, tag,
                                    BoolPack<Rules::SkipUnknownTags, Rules::StrictMode>{});

                    }

                    TRY_ADVANCE("Got early EOF");

                }

                if (!hasError())
                    callVisitor(header, message, std::is_void<typename Context::Type>{});
            }